

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
* __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getInterfaceConn
          (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
           *__return_storage_ptr__,PortConnectionBuilder *this,ASTContext *context,
          InterfacePortSymbol *port,ExpressionSyntax *syntax)

{
  __extent_storage<18446744073709551615UL> _Var1;
  pointer pCVar2;
  Scope *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  DeferredSourceRange sourceRange;
  span<const_slang::ConstantRange,_18446744073709551615UL> left;
  span<const_slang::ConstantRange,_18446744073709551615UL> right;
  pointer pCVar3;
  size_type sVar4;
  bool bVar5;
  Expression *this_01;
  Type *this_02;
  DefinitionSymbol *this_03;
  ModportSymbol *pMVar6;
  Diagnostic *pDVar7;
  Diagnostic *pDVar8;
  size_t sVar9;
  char *pcVar10;
  __extent_storage<18446744073709551615UL> _Var11;
  ulong uVar12;
  InstanceArraySymbol *array;
  Symbol *symbol;
  SourceRange SVar13;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __y;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_01;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_01;
  ModportSymbol *modport;
  anon_class_40_5_9960d2bb makeResult;
  Expression *expr;
  undefined8 local_98;
  undefined8 uStack_90;
  ExpressionSyntax *local_88;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> portDims;
  SmallVector<slang::ConstantRange,_4UL> dims;
  
  InterfacePortSymbol::getDeclaredRange(&portDims,port);
  if (portDims.
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged == false) {
    (__return_storage_ptr__->first).first = (Symbol *)0x0;
    (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
    __return_storage_ptr__->second = (Expression *)0x0;
    return __return_storage_ptr__;
  }
  this_01 = Expression::tryBindInterfaceRef(context,syntax,true);
  if ((this_01 == (Expression *)0x0) || (expr = this_01, bVar5 = Expression::bad(this_01), bVar5)) {
    (__return_storage_ptr__->first).first = (Symbol *)0x0;
    (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
    __return_storage_ptr__->second = (Expression *)0x0;
    return __return_storage_ptr__;
  }
  dims.super_SmallVectorBase<slang::ConstantRange>.data_ =
       (pointer)dims.super_SmallVectorBase<slang::ConstantRange>.firstElement;
  dims.super_SmallVectorBase<slang::ConstantRange>.len = 0;
  dims.super_SmallVectorBase<slang::ConstantRange>.cap = 4;
  this_02 = (this_01->type).ptr;
  while (bVar5 = Type::isUnpackedArray(this_02), bVar5) {
    makeResult.this = (PortConnectionBuilder *)Type::getFixedRange(this_02);
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
              (&dims.super_SmallVectorBase<slang::ConstantRange>,(ConstantRange *)&makeResult);
    this_02 = Type::getArrayElementType(this_02);
  }
  this_03 = InstanceSymbol::getDefinition(*(InstanceSymbol **)&this_02[1].super_Symbol);
  if ((this_03 == port->interfaceDef) || (port->isGeneric != false)) {
    pMVar6 = (ModportSymbol *)this_02[1].super_Symbol.name._M_len;
    sVar9 = (port->modport)._M_len;
    if (sVar9 == 0) {
LAB_002061a5:
      modport = pMVar6;
      sVar4 = dims.super_SmallVectorBase<slang::ConstantRange>.len;
      pCVar3 = dims.super_SmallVectorBase<slang::ConstantRange>.data_;
      makeResult.modport = &modport;
      makeResult.expr = &expr;
      symbol = *(Symbol **)(this_01 + 1);
      left._M_extent._M_extent_value =
           (size_t)portDims.
                   super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                   ._M_payload._M_value._M_extent._M_extent_value;
      left._M_ptr = portDims.
                    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                    ._M_payload._M_value._M_ptr;
      right._M_extent._M_extent_value = dims.super_SmallVectorBase<slang::ConstantRange>.len;
      right._M_ptr = dims.super_SmallVectorBase<slang::ConstantRange>.data_;
      makeResult.this = this;
      makeResult.port = port;
      makeResult.portDims = &portDims;
      bVar5 = areDimSizesEqual(left,right);
      if (bVar5) {
        context = (ASTContext *)&makeResult;
        getInterfaceConn::anon_class_40_5_9960d2bb::operator()
                  (__return_storage_ptr__,(anon_class_40_5_9960d2bb *)context,symbol);
        goto LAB_00206453;
      }
      _Var1._M_extent_value = (this->instanceDims).super_SmallVectorBase<slang::ConstantRange>.len;
      if (_Var1._M_extent_value <= sVar4) {
        _Var11._M_extent_value = sVar4;
        if (_Var1._M_extent_value != 0xffffffffffffffff) {
          _Var11._M_extent_value = _Var1._M_extent_value;
        }
        pCVar2 = (this->instanceDims).super_SmallVectorBase<slang::ConstantRange>.data_;
        right_00._M_extent._M_extent_value = _Var1._M_extent_value;
        right_00._M_ptr = pCVar2;
        left_00._M_extent._M_extent_value = _Var11._M_extent_value;
        left_00._M_ptr = pCVar3;
        bVar5 = areDimSizesEqual(left_00,right_00);
        if ((bVar5) &&
           (left_01._M_ptr = pCVar3 + _Var1._M_extent_value,
           right_01._M_extent._M_extent_value =
                (size_t)portDims.
                        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                        ._M_payload._M_value._M_extent._M_extent_value,
           right_01._M_ptr =
                portDims.
                super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                ._M_payload._M_value._M_ptr,
           left_01._M_extent._M_extent_value = sVar4 - _Var1._M_extent_value,
           bVar5 = areDimSizesEqual(left_01,right_01), bVar5)) {
          for (sVar9 = 0;
              (this->instance->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value !=
              sVar9; sVar9 = sVar9 + 1) {
            uVar12 = (ulong)(this->instance->super_InstanceSymbolBase).arrayPath._M_ptr[sVar9];
            if (pCVar2[sVar9].right <= pCVar2[sVar9].left !=
                *(int *)((long)&symbol[2].name._M_len + 4) <= (int)symbol[2].name._M_len) {
              uVar12 = ~uVar12 + *(long *)(symbol + 2);
            }
            symbol = *(Symbol **)(&(symbol[1].originatingSyntax)->kind + uVar12 * 2);
          }
          context = (ASTContext *)&makeResult;
          getInterfaceConn::anon_class_40_5_9960d2bb::operator()
                    (__return_storage_ptr__,(anon_class_40_5_9960d2bb *)context,symbol);
          goto LAB_00206453;
        }
      }
      this_00 = this->scope;
      SVar13 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      pDVar7 = Scope::addDiag(this_00,(DiagCode)0x9d0006,SVar13);
      pDVar7 = Diagnostic::operator<<(pDVar7,(port->super_Symbol).name);
      context = (ASTContext *)0x50001;
      Diagnostic::addNote(pDVar7,(DiagCode)0x50001,(port->super_Symbol).location);
    }
    else {
      modport = pMVar6;
      if ((pMVar6 == (ModportSymbol *)0x0) ||
         (__x._M_len = (pMVar6->super_Symbol).name._M_len,
         __x._M_str = (pMVar6->super_Symbol).name._M_str, __y._M_str = (port->modport)._M_str,
         __y._M_len = sVar9, bVar5 = std::operator==(__x,__y), bVar5)) {
        local_98 = 0;
        uStack_90 = 0;
        sourceRange.node.value = (uintptr_t)syntax;
        sourceRange.range = (SourceRange)ZEXT816(0);
        local_88 = syntax;
        pMVar6 = InterfacePortSymbol::getModport
                           (port,context,*(InstanceSymbol **)&this_02[1].super_Symbol,sourceRange);
        if (pMVar6 != (ModportSymbol *)0x0) goto LAB_002061a5;
      }
      else {
        SVar13 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        pDVar7 = ASTContext::addDiag(context,(DiagCode)0x820006,SVar13);
        pDVar8 = Diagnostic::operator<<(pDVar7,(this_03->super_Symbol).name);
        Diagnostic::operator<<(pDVar8,(pMVar6->super_Symbol).name);
        if (port->isGeneric == false) {
          sVar9 = (port->interfaceDef->super_Symbol).name._M_len;
          pcVar10 = (port->interfaceDef->super_Symbol).name._M_str;
        }
        else {
          pcVar10 = "interface";
          sVar9 = 9;
        }
        arg._M_str = pcVar10;
        arg._M_len = sVar9;
        Diagnostic::operator<<(pDVar7,arg);
        context = (ASTContext *)(port->modport)._M_len;
        Diagnostic::operator<<(pDVar7,port->modport);
      }
    }
  }
  else {
    SVar13 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    pDVar7 = ASTContext::addDiag(context,(DiagCode)0x540006,SVar13);
    Symbol::getHierarchicalPath_abi_cxx11_((string *)&makeResult,&this_03->super_Symbol);
    pDVar8 = Diagnostic::operator<<(pDVar7,(string *)&makeResult);
    Diagnostic::operator<<(pDVar8,(port->interfaceDef->super_Symbol).name);
    std::__cxx11::string::~string((string *)&makeResult);
    context = (ASTContext *)0x50001;
    Diagnostic::addNote(pDVar7,(DiagCode)0x50001,(port->super_Symbol).location);
  }
  (__return_storage_ptr__->first).first = (Symbol *)0x0;
  (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
  __return_storage_ptr__->second = (Expression *)0x0;
LAB_00206453:
  SmallVectorBase<slang::ConstantRange>::cleanup
            (&dims.super_SmallVectorBase<slang::ConstantRange>,(EVP_PKEY_CTX *)context);
  return __return_storage_ptr__;
}

Assistant:

std::pair<PortConnection::IfaceConn, const Expression*> getInterfaceConn(
        ASTContext& context, const InterfacePortSymbol& port, const ExpressionSyntax& syntax) {
        SLANG_ASSERT(!port.isInvalid());

        auto makeError = []() -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{nullptr, nullptr}, nullptr};
        };

        auto portDims = port.getDeclaredRange();
        if (!portDims)
            return makeError();

        auto expr = Expression::tryBindInterfaceRef(context, syntax,
                                                    /* isInterfacePort */ true);
        if (!expr || expr->bad())
            return makeError();

        // Pull out the expression type, which should always be a virtual interface or
        // array of such types, and decompose into dims and interface info.
        SmallVector<ConstantRange, 4> dims;
        auto type = expr->type;
        while (type->isUnpackedArray()) {
            dims.push_back(type->getFixedRange());
            type = type->getArrayElementType();
        }

        auto& vit = type->as<VirtualInterfaceType>();
        auto& connDef = vit.iface.getDefinition();

        SLANG_ASSERT(vit.isRealIface);
        SLANG_ASSERT(port.isGeneric || port.interfaceDef);
        if (&connDef != port.interfaceDef && !port.isGeneric) {
            auto& diag = context.addDiag(diag::InterfacePortTypeMismatch, syntax.sourceRange());
            diag << connDef.getHierarchicalPath() << port.interfaceDef->name;
            diag.addNote(diag::NoteDeclarationHere, port.location);
            return makeError();
        }

        // Modport must match the specified requirement, if we have one.
        auto modport = vit.modport;
        if (!port.modport.empty()) {
            if (modport && modport->name != port.modport) {
                auto& diag = context.addDiag(diag::ModportConnMismatch, syntax.sourceRange());
                diag << connDef.name << modport->name;
                diag << (port.isGeneric ? "interface"sv : port.interfaceDef->name);
                diag << port.modport;
                return makeError();
            }

            auto sym = port.getModport(context, vit.iface, syntax);
            if (!sym)
                return makeError();

            modport = sym;
        }

        auto makeResult =
            [&](const Symbol* symbol) -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{rewireIfaceArrayIndices(symbol, port.name, port.location, *portDims), modport},
                    expr};
        };

        // Make the connection if the dimensions match exactly what the port is expecting.
        const Symbol* symbol = expr->as<ArbitrarySymbolExpression>().symbol;
        if (areDimSizesEqual(*portDims, dims))
            return makeResult(symbol);

        // Otherwise, if the instance being instantiated is part of an array of instances *and*
        // the symbol we're connecting to is an array of interfaces, we need to check to see whether
        // to slice up that array among all the instances. We do the slicing operation if:
        // instance array dimensions + port dimensions == connection dimensions
        std::span<const ConstantRange> dimSpan = dims;
        if (dimSpan.size() >= instanceDims.size() &&
            areDimSizesEqual(dimSpan.subspan(0, instanceDims.size()), instanceDims) &&
            areDimSizesEqual(dimSpan.subspan(instanceDims.size()), *portDims)) {

            // It's ok to do the slicing, so pick the correct slice for the connection
            // based on the actual path of the instance we're elaborating.
            for (size_t i = 0; i < instance.arrayPath.size(); i++) {
                // We want to match left index to left index, so if the dimensions
                // are in reversed order we need to reverse our index here.
                auto& array = symbol->as<InstanceArraySymbol>();
                size_t index = instance.arrayPath[i];
                if (instanceDims[i].isLittleEndian() != array.range.isLittleEndian())
                    index = array.elements.size() - index - 1;

                symbol = array.elements[index];
            }

            return makeResult(symbol);
        }

        auto& diag = scope.addDiag(diag::PortConnDimensionsMismatch, syntax.sourceRange())
                     << port.name;
        diag.addNote(diag::NoteDeclarationHere, port.location);
        return makeError();
    }